

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

void sx_semaphore_post(sx_sem *sem,int count)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)sem);
  if (iVar2 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                      0x1ad,"r == 0");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if (0 < count) {
    iVar2 = count;
    do {
      iVar3 = pthread_cond_signal((pthread_cond_t *)(sem->data + 0x28));
      if (iVar3 != 0) {
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c"
                          ,0x1b1,"r == 0");
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  *(int *)(sem->data + 0x58) = *(int *)(sem->data + 0x58) + count;
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)sem);
  if (iVar2 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                      0x1b6,"r == 0");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  return;
}

Assistant:

void sx_semaphore_post(sx_sem* sem, int count)
{
    sx__sem* _sem = (sx__sem*)sem->data;
    int r = pthread_mutex_lock(&_sem->mutex);
    sx_assert(r == 0);

    for (int ii = 0; ii < count; ii++) {
        r = pthread_cond_signal(&_sem->cond);
        sx_assert(r == 0);
    }

    _sem->count += count;
    r = pthread_mutex_unlock(&_sem->mutex);
    sx_assert(r == 0);

    sx_unused(r);
}